

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int write_file_descriptors(archive_write *a)

{
  undefined2 uVar1;
  undefined4 uVar2;
  void *pvVar3;
  undefined1 uVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int64_t offset;
  iso9660_conflict *iso9660;
  long lVar9;
  int64_t *piVar10;
  
  pvVar3 = a->format_data;
  if (*(long *)((long)pvVar3 + 0x10320) != 0) {
    lVar9 = *(long *)((long)pvVar3 + 0x102e0);
    memset((void *)((long)pvVar3 + (0x102dc - lVar9)),0,0x800);
    *(undefined1 *)((long)pvVar3 + (0x102dc - lVar9)) = 1;
    *(undefined1 *)((long)pvVar3 + (0x102dd - lVar9)) = *(undefined1 *)((long)pvVar3 + 0x10348);
    *(undefined2 *)((long)pvVar3 + (0x102de - lVar9)) = 0;
    if (*(long *)((long)pvVar3 + 0x10358) != 0) {
      strncpy((char *)((long)pvVar3 + (0x102e0 - lVar9)),*(char **)((long)pvVar3 + 0x10350),0x17);
    }
    *(undefined2 *)((long)pvVar3 + (0x102f7 - lVar9)) = 0;
    *(undefined1 *)((long)pvVar3 + (0x102f9 - lVar9)) = 0;
    *(undefined2 *)((long)pvVar3 + (0x102fa - lVar9)) = 0xaa55;
    uVar7 = 0xfffffffffffffffe;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + *(short *)((long)pvVar3 + uVar7 + (0x102de - lVar9));
      uVar7 = uVar7 + 2;
    } while (uVar7 < 0x1e);
    *(char *)((long)pvVar3 + (0x102f8 - lVar9)) = (char)-(uint)uVar5;
    *(char *)((long)pvVar3 + (0x102f9 - lVar9)) = (char)(-(uint)uVar5 >> 8);
    *(undefined1 *)((long)pvVar3 + (0x102fc - lVar9)) = 0x88;
    *(undefined1 *)((long)pvVar3 + (0x102fd - lVar9)) = *(undefined1 *)((long)pvVar3 + 0x10368);
    if (*(char *)((long)pvVar3 + 0x10368) == '\0') {
      uVar1 = *(undefined2 *)((long)pvVar3 + 0x1036a);
      *(char *)((long)pvVar3 + (0x102fe - lVar9)) = (char)uVar1;
      uVar4 = (undefined1)((ushort)uVar1 >> 8);
    }
    else {
      *(undefined1 *)((long)pvVar3 + (0x102fe - lVar9)) = 0;
      uVar4 = 0;
    }
    *(undefined1 *)((long)pvVar3 + (0x102ff - lVar9)) = uVar4;
    *(undefined1 *)((long)pvVar3 + (0x10300 - lVar9)) = *(undefined1 *)((long)pvVar3 + 0x10369);
    *(undefined1 *)((long)pvVar3 + (0x10301 - lVar9)) = 0;
    if (*(char *)((long)pvVar3 + 0x10368) == '\0') {
      uVar1 = *(undefined2 *)((long)pvVar3 + 0x1036c);
      *(char *)((long)pvVar3 + (0x10302 - lVar9)) = (char)uVar1;
      uVar4 = (undefined1)((ushort)uVar1 >> 8);
    }
    else {
      *(undefined1 *)((long)pvVar3 + (0x10302 - lVar9)) = 1;
      uVar4 = 0;
    }
    *(undefined1 *)((long)pvVar3 + (0x10303 - lVar9)) = uVar4;
    uVar2 = *(undefined4 *)(*(long *)(*(long *)((long)pvVar3 + 0x10340) + 0x18) + 0xa4);
    *(char *)((long)pvVar3 + (0x10304 - lVar9)) = (char)uVar2;
    *(char *)((long)pvVar3 + (0x10305 - lVar9)) = (char)((uint)uVar2 >> 8);
    *(char *)((long)pvVar3 + (0x10306 - lVar9)) = (char)((uint)uVar2 >> 0x10);
    *(char *)((long)pvVar3 + (0x10307 - lVar9)) = (char)((uint)uVar2 >> 0x18);
    *(undefined8 *)((long)pvVar3 + (0x10308 - lVar9)) = 0;
    *(undefined8 *)((long)pvVar3 + (0x10310 - lVar9)) = 0;
    *(undefined4 *)((long)pvVar3 + (0x10318 - lVar9)) = 0;
    iVar6 = wb_consume(a,0x800);
    if (iVar6 < 0) {
      return iVar6;
    }
  }
  if (*(long *)((long)pvVar3 + 0x10340) != 0) {
    lVar9 = *(long *)(*(long *)((long)pvVar3 + 0x10340) + 0x18);
    lVar8 = (long)*(int *)(lVar9 + 0xa0);
    lVar9 = *(long *)(lVar9 + 0x90);
    if (lVar9 == 0) goto LAB_004b0fb8;
    iVar6 = write_file_contents(a,lVar9,lVar8 << 0xb);
    if (iVar6 < 0) {
      return iVar6;
    }
  }
  lVar8 = 0;
LAB_004b0fb8:
  offset = 0;
  for (lVar9 = *(long *)((long)pvVar3 + 0x98); lVar9 != 0; lVar9 = *(long *)(lVar9 + 8)) {
    if (*(int *)(lVar9 + 0xb8) != 0) {
      piVar10 = (int64_t *)(lVar9 + 0x90);
      if (offset + lVar8 * 0x800 < *(long *)(lVar9 + 0x90)) {
        if ((0 < lVar8) && (iVar6 = write_file_contents(a,offset,lVar8 * 0x800), iVar6 < 0)) {
          return iVar6;
        }
        offset = *piVar10;
        lVar8 = 0;
      }
      *(int64_t **)(lVar9 + 0xb0) = piVar10;
      do {
        lVar8 = lVar8 + (int)piVar10[2];
        piVar10 = (int64_t *)piVar10[3];
      } while (piVar10 != (int64_t *)0x0);
      *(undefined8 *)(lVar9 + 0xb0) = 0;
    }
  }
  if ((0 < lVar8) && (iVar6 = write_file_contents(a,offset,lVar8 << 0xb), iVar6 < 0)) {
    return iVar6;
  }
  return 0;
}

Assistant:

static int
write_file_descriptors(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file;
	int64_t blocks, offset;
	int r;

	blocks = 0;
	offset = 0;

	/* Make the boot catalog contents, and write it. */
	if (iso9660->el_torito.catalog != NULL) {
		r = make_boot_catalog(a);
		if (r < 0)
			return (r);
	}

	/* Write the boot file contents. */
	if (iso9660->el_torito.boot != NULL) {
		file = iso9660->el_torito.boot->file;
		blocks = file->content.blocks;
		offset = file->content.offset_of_temp;
		if (offset != 0) {
			r = write_file_contents(a, offset,
			    blocks << LOGICAL_BLOCK_BITS);
			if (r < 0)
				return (r);
			blocks = 0;
			offset = 0;
		}
	}

	/* Write out all file contents. */
	for (file = iso9660->data_file_list.first;
	    file != NULL; file = file->datanext) {

		if (!file->write_content)
			continue;

		if ((offset + (blocks << LOGICAL_BLOCK_BITS)) <
		     file->content.offset_of_temp) {
			if (blocks > 0) {
				r = write_file_contents(a, offset,
				    blocks << LOGICAL_BLOCK_BITS);
				if (r < 0)
					return (r);
			}
			blocks = 0;
			offset = file->content.offset_of_temp;
		}

		file->cur_content = &(file->content);
		do {
			blocks += file->cur_content->blocks;
			/* Next fragment */
			file->cur_content = file->cur_content->next;
		} while (file->cur_content != NULL);
	}

	/* Flush out remaining blocks. */
	if (blocks > 0) {
		r = write_file_contents(a, offset,
		    blocks << LOGICAL_BLOCK_BITS);
		if (r < 0)
			return (r);
	}

	return (ARCHIVE_OK);
}